

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getRSS.h
# Opt level: O2

string * __thiscall
bwtil::getFormattedSpaceUsage_abi_cxx11_(string *__return_storage_ptr__,bwtil *this,ulint bytes)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  char *pcVar3;
  undefined1 auVar4 [64];
  stringstream ss;
  stringstream asStack_198 [392];
  undefined1 extraout_var [56];
  
  auVar4._0_8_ = std::__cxx11::stringstream::stringstream(asStack_198);
  auVar4._8_56_ = extraout_var;
  if (this < (bwtil *)0x40000000) {
    if (this < (bwtil *)0x100000) {
      if (this < (bwtil *)0x400) goto LAB_001023e6;
      poVar2 = std::ostream::_M_insert<double>((double)(long)this * 0.0009765625);
      pcVar3 = " KB";
    }
    else {
      poVar2 = std::ostream::_M_insert<double>((double)(long)this * 9.5367431640625e-07);
      pcVar3 = " MB";
    }
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(auVar4._0_16_,this);
    poVar2 = std::ostream::_M_insert<double>(auVar1._0_8_ * 9.313225746154785e-10);
    pcVar3 = " GB";
  }
  std::operator<<(poVar2,pcVar3);
LAB_001023e6:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

string getFormattedSpaceUsage(ulint bytes){

	stringstream ss;

	if(bytes/((ulint)1<<30) > 0)
		ss << (double)bytes/((ulint)1<<30) << " GB";
	else if (bytes/((ulint)1<<20) > 0)
		ss << (double)bytes/((ulint)1<<20) << " MB";
	else if (bytes/((ulint)1<<10) > 0)
		ss << (double)bytes/((ulint)1<<10) << " KB";

	return ss.str();

}